

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

bool __thiscall Js::FunctionBody::IsGeneratorAndJitIsDisabled(FunctionBody *this)

{
  FunctionInfo *pFVar1;
  Utf8SourceInfo *pUVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  if ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x50d,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_007650c1;
    *puVar5 = 0;
  }
  if ((FunctionBody *)
      (((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->functionBodyImpl)
      .ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x50e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar4) goto LAB_007650c1;
    *puVar5 = 0;
  }
  pFVar1 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if ((pFVar1->attributes & (Async|Generator)) == None) {
    bVar4 = false;
  }
  else {
    if (DAT_015b0228 != '\x01') {
      return true;
    }
    if (((this->super_ParseableFunctionInfo).flags & Flags_HasTry) != Flags_None) {
      return true;
    }
    pUVar2 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
    if ((((pUVar2->debugModeSource).ptr != (uchar *)0x0) || ((pUVar2->field_0xa8 & 0x20) != 0)) &&
       ((pUVar2->field_0xa8 & 0x40) != 0)) {
      return true;
    }
    if (pFVar1 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x57d,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar4) goto LAB_007650c1;
      *puVar5 = 0;
    }
    if ((FunctionBody *)
        (((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
        functionBodyImpl).ptr != this) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x57e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                  "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar4) {
LAB_007650c1:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    bVar4 = (bool)((*(byte *)((long)&((this->super_ParseableFunctionInfo).super_FunctionProxy.
                                      functionInfo.ptr)->attributes + 2) & 2) >> 1);
  }
  return bVar4;
}

Assistant:

bool
    FunctionBody::IsGeneratorAndJitIsDisabled() const
    {
        return this->IsCoroutine() && !(CONFIG_FLAG(JitES6Generators) && !this->GetHasTry() && !this->IsInDebugMode() && !this->IsModule());
    }